

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

int __thiscall
S2Builder::EdgeChainSimplifier::input_edge_layer(EdgeChainSimplifier *this,InputEdgeId id)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  InputEdgeId id_local;
  S2LogMessage local_18;
  
  id_local = id;
  if (-1 < id) {
    _Var1 = std::
            __upper_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Val_less_iter>
                      ((this->layer_begins_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->layer_begins_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,&id_local);
    return (int)((ulong)((long)_Var1._M_current +
                        (-4 - (long)(this->layer_begins_->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start)) >> 2);
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x5a8,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_18.stream_,"Check failed: (id) >= (0) ");
  abort();
}

Assistant:

int S2Builder::EdgeChainSimplifier::input_edge_layer(InputEdgeId id) const {
  // NOTE(ericv): If this method shows up in profiling, the result could be
  // stored with each edge (i.e., edge_layers_ and new_edge_layers_).
  S2_DCHECK_GE(id, 0);
  return (std::upper_bound(layer_begins_.begin(), layer_begins_.end(), id) -
          (layer_begins_.begin() + 1));
}